

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<0,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Vector<float,_3> *pVVar6;
  int col;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m_1;
  Mat3 m;
  float afStack_b8 [6];
  float local_a0 [2];
  undefined8 local_98;
  undefined4 local_90;
  Matrix<float,_3,_3> local_88;
  Matrix<float,_3,_3> local_58;
  Matrix<float,_3,_3> local_2c;
  long lVar10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_58;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      auVar8 = _DAT_00a99400;
      do {
        bVar11 = SUB164(auVar8 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar8 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7 + 0xc) = uVar12;
        }
        lVar10 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0xc;
      pfVar1 = pfVar1 + 1;
    } while (lVar5 != 3);
    local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_58.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_58.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_58.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_58.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    local_58.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_58;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[2] = 0.0;
    local_58.m_data.m_data[2].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[1] = 0.0;
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[0].m_data[2] = 0.0;
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar6 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar5 != 3);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_88;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      auVar9 = _DAT_00a99400;
      do {
        bVar11 = SUB164(auVar9 ^ _DAT_00a99450,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00a99450,0) < -0x7ffffffd;
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7) = uVar12;
        }
        if (bVar11) {
          uVar12 = 0x3f800000;
          if (lVar3 + -0xc != lVar7) {
            uVar12 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar7 + 0xc) = uVar12;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar7 = lVar7 + 0x18;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0xc;
      pfVar1 = pfVar1 + 1;
    } while (lVar5 != 3);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_88.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_88.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_88.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_88;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &DAT_00af0a94;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar6 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar5 != 3);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 3);
  }
  tcu::operator+(&local_2c,&local_58,&local_88);
  local_98 = (ulong)local_98._4_4_ << 0x20;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3] =
         local_2c.m_data.m_data[0].m_data[lVar3] + local_2c.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_b8[4] = 0.0;
  afStack_b8[2] = 0.0;
  afStack_b8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_b8[lVar3 + 2] = local_a0[lVar3] + local_2c.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar3]] = afStack_b8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}